

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testValid_WithMSE(void)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  bool bVar2;
  char *targetName;
  ModelDescription *pMVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  reference from;
  NeuralNetwork *this;
  NetworkUpdateParameters *this_00;
  LossLayer *this_01;
  MeanSquaredErrorLossLayer *this_02;
  string *psVar5;
  FeatureType *this_03;
  ostream *poVar6;
  undefined1 local_200 [48];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  set<long,_std::less<long>,_std::allocator<long>_> local_1a8;
  set<long,_std::less<long>,_std::allocator<long>_> local_178;
  ArrayFeatureType *local_148;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *local_120;
  FeatureDescription *trainingInput;
  FeatureDescription *trainingInput_1;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  string local_c0;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_57e1f;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_57e36;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)&tensorAttributesOut.dimension,
             (TensorAttributes *)&neuralNet,0x400,false,false);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  local_c0._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::Model::mutable_neuralnetwork((Model *)(local_68 + 0x28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"mse_target",(allocator *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  _Var1._M_storage = local_c0._M_storage._M_storage;
  targetName = (char *)std::__cxx11::string::c_str();
  addMeanSquareError<CoreML::Specification::NeuralNetwork>
            ((Model *)(local_68 + 0x28),(NeuralNetwork *)_Var1._M_storage,"mean_square_error",
             "OutTensor",targetName);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar3);
  pMVar3 = CoreML::Specification::Model::description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::input(pMVar3);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar4);
  feature._40_8_ =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar4);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&feature._cached_size_), bVar2) {
    from = google::protobuf::internal::
           RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*(&__end1);
    CoreML::Specification::FeatureDescription::FeatureDescription
              ((FeatureDescription *)&trainingInput_1,from);
    pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
    trainingInput =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
    CoreML::Specification::FeatureDescription::CopyFrom
              (trainingInput,(FeatureDescription *)&trainingInput_1);
    CoreML::Specification::FeatureDescription::~FeatureDescription
              ((FeatureDescription *)&trainingInput_1);
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar3);
  local_120 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                        (pRVar4);
  this = CoreML::Specification::Model::neuralnetwork((Model *)(local_68 + 0x28));
  this_00 = CoreML::Specification::NeuralNetwork::updateparams(this);
  this_01 = CoreML::Specification::NetworkUpdateParameters::losslayers(this_00,0);
  this_02 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(this_01);
  psVar5 = CoreML::Specification::MeanSquaredErrorLossLayer::target_abi_cxx11_(this_02);
  std::__cxx11::string::string((string *)&trainingInputTensorShape,(string *)psVar5);
  CoreML::Specification::FeatureDescription::set_name(local_120,&local_c0);
  this_03 = CoreML::Specification::FeatureDescription::mutable_type(local_120);
  local_148 = CoreML::Specification::FeatureType::mutable_multiarraytype(this_03);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (local_148,ArrayFeatureType_ArrayDataType_DOUBLE);
  CoreML::Specification::ArrayFeatureType::add_shape(local_148,1);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)local_c0._M_storage._M_storage,kSgdOptimizer,0.699999988079071,0.0,1.0
            );
  _Var1._M_storage = local_c0._M_storage._M_storage;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_178._M_t._M_impl._0_8_ = 0;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_178);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,kSgdOptimizer,10,5,100,&local_178);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_178);
  _Var1._M_storage = local_c0._M_storage._M_storage;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1a8._M_t._M_impl._0_8_ = 0;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_1a8);
  addEpochs<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,100,1,100,&local_1a8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_1a8);
  _Var1._M_storage = local_c0._M_storage._M_storage;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_200[0x28] = '\0';
  local_200[0x29] = '\0';
  local_200[0x2a] = '\0';
  local_200[0x2b] = '\0';
  local_200[0x2c] = '\0';
  local_200[0x2d] = '\0';
  local_200[0x2e] = '\0';
  local_200[0x2f] = '\0';
  uStack_1d0 = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)(local_200 + 0x28));
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            ((NeuralNetwork *)_Var1._M_storage,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)(local_200 + 0x28));
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)(local_200 + 0x28));
  CoreML::Model::validate((Result *)local_200,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,(Result *)local_200);
  CoreML::Result::~Result((Result *)local_200);
  bVar2 = CoreML::Result::good((Result *)local_68);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x966);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  spec._oneof_case_[0]._1_3_ = 0;
  spec._oneof_case_[0]._0_1_ = !bVar2;
  std::__cxx11::string::~string((string *)&trainingInputTensorShape);
  std::__cxx11::string::~string((string *)&local_c0);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testValid_WithMSE() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    std::string targetName = "mse_target";
    addMeanSquareError(spec, neuralNet, "mean_square_error", "OutTensor", targetName.c_str());

    spec.mutable_description()->clear_traininginput();

    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetwork().updateparams().losslayers(0).meansquarederrorlosslayer().target();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    trainingInputTensorShape->add_shape(1);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}